

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cpp
# Opt level: O0

anon_unknown_dwarf_4c98f * __thiscall
anon_unknown.dwarf_4c98f::prefix
          (anon_unknown_dwarf_4c98f *this,bool prev_emitted,indent ind,string *property)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  indent local_a0 [8];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *property_local;
  bool prev_emitted_local;
  anon_unknown_dwarf_4c98f *paStack_10;
  indent ind_local;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16b0f0;
  if (prev_emitted) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16ba80;
  }
  local_20 = property;
  property_local._3_1_ = prev_emitted;
  property_local._4_4_ = ind.distance_;
  paStack_10 = this;
  pstore::exchange::export_ns::indent::str_abi_cxx11_(local_a0);
  std::operator+((char *)local_80,__rhs);
  std::operator+(local_60,(char)local_80);
  std::operator+(local_40,local_60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)local_a0);
  return this;
}

Assistant:

std::string prefix (bool prev_emitted, pstore::exchange::export_ns::indent const ind,
                        std::string const & property) {
        return (prev_emitted ? ",\n" : "") + ind.str () + '"' + property + "\":";
    }